

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

void __thiscall duckdb::AsOfGlobalSinkState::~AsOfGlobalSinkState(AsOfGlobalSinkState *this)

{
  ~AsOfGlobalSinkState(this);
  operator_delete(this);
  return;
}

Assistant:

AsOfGlobalSinkState(ClientContext &context, const PhysicalAsOfJoin &op)
	    : rhs_sink(context, op.rhs_partitions, op.rhs_orders, op.children[1].get().GetTypes(), {},
	               op.estimated_cardinality),
	      is_outer(IsRightOuterJoin(op.join_type)), has_null(false) {
	}